

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GrcManager::DebugXmlGlyphs(GrcManager *this,GrcFont *pfont,ofstream *strmOut,string *staPathToCur)

{
  bool bVar1;
  int iVar2;
  Symbol pGVar3;
  size_type_conflict sVar4;
  reference ppGVar5;
  ostream *poVar6;
  reference pvVar7;
  reference pvVar8;
  GrpLineAndFile *this_00;
  string *staPath;
  string *psVar9;
  string *in_RCX;
  ostream *in_RDX;
  GrcFont *in_RSI;
  GrcManager *in_RDI;
  ulong uVar10;
  ulong uVar11;
  GrpLineAndFile lnf;
  bool fShadow;
  bool fOverride;
  int munitPR;
  int nPR;
  GdlExpression *pexp;
  int nValue;
  uint nAttrID_1;
  uint wGlyphID;
  int fxdGlatVersion;
  vector<int,_std::allocator<int>_> vnSingleMemberClassLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vstaSingleMemberClassFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vstaSingleMemberClasses;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwXPsdForUni;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vnXUniForPsd;
  uint *rgnGlyphIDToUni;
  utf16 *rgchwUniToGlyphID;
  int cnUni;
  string staExpType;
  Symbol psymGlyphAttr;
  size_t nAttrID;
  int nAttrIdJStr;
  Symbol psymJStr;
  uint nAttrIdSkipP2;
  Symbol psymSkipP2;
  uint nAttrIdSkipP;
  Symbol psymSkipP;
  uint nAttrIdDir;
  Symbol psymDir;
  uint nAttrIdBw;
  Symbol psymBw;
  uint nAttrIdActual;
  Symbol psymActual;
  string *sta;
  GrcSymbolTableEntry *in_stack_fffffffffffffac0;
  GdlRenderer *in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffad0;
  undefined2 in_stack_fffffffffffffad4;
  gid16 in_stack_fffffffffffffad6;
  uint in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  string *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  ostream *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffafc;
  byte in_stack_fffffffffffffafd;
  undefined1 in_stack_fffffffffffffafe;
  undefined1 in_stack_fffffffffffffaff;
  GrcSymbolTable *in_stack_fffffffffffffb00;
  GrcSymbolTableEntry *in_stack_fffffffffffffb08;
  ostream *in_stack_fffffffffffffb10;
  ofstream *in_stack_fffffffffffffb18;
  undefined6 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb26;
  undefined1 in_stack_fffffffffffffb27;
  undefined1 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb29;
  undefined1 in_stack_fffffffffffffb2a;
  undefined1 in_stack_fffffffffffffb2b;
  ExpressionType in_stack_fffffffffffffb2c;
  string *in_stack_fffffffffffffb30;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb40;
  GrcFont *in_stack_fffffffffffffb48;
  GrcManager *in_stack_fffffffffffffb50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffb60;
  GrcSymbolTableEntry *this_01;
  string local_380 [32];
  string local_360 [39];
  undefined1 local_339 [33];
  string local_318 [36];
  undefined4 local_2f4;
  undefined1 local_2f0 [47];
  string local_2c1 [17];
  int local_2b0;
  uint local_2ac;
  uint local_2a8;
  int local_2a4;
  string local_2a0 [32];
  vector<int,_std::allocator<int>_> local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  string local_238 [48];
  GdlNumericExpression *local_208;
  GdlNumericExpression *local_200;
  int local_1f4;
  string local_1f0 [32];
  string local_1d0 [32];
  GrcSymbolTableEntry *local_1b0;
  ulong local_1a8;
  int local_1a0;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [56];
  Symbol local_138;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [36];
  uint local_dc;
  GrcSymbolTableEntry *local_d8;
  uint local_cc;
  GrcSymbolTableEntry *local_c8;
  uint local_c0;
  allocator local_b9;
  string local_b8 [32];
  Symbol local_98;
  uint local_90;
  allocator local_89;
  string local_88 [32];
  Symbol local_68;
  uint local_60;
  allocator local_49;
  string local_48 [32];
  Symbol local_28;
  ostream *local_18;
  GrcFont *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::operator<<(in_RDX,"  <glyphAttrs>\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"*actualForPseudo*",&local_49);
  pGVar3 = GrcSymbolTable::FindSymbol
                     (in_stack_fffffffffffffb00,
                      (string *)
                      CONCAT17(in_stack_fffffffffffffaff,
                               CONCAT16(in_stack_fffffffffffffafe,
                                        CONCAT15(in_stack_fffffffffffffafd,
                                                 CONCAT14(in_stack_fffffffffffffafc,
                                                          in_stack_fffffffffffffaf8)))));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pGVar3;
  local_60 = GrcSymbolTableEntry::InternalID(pGVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"breakweight",&local_89);
  pGVar3 = GrcSymbolTable::FindSymbol
                     (in_stack_fffffffffffffb00,
                      (string *)
                      CONCAT17(in_stack_fffffffffffffaff,
                               CONCAT16(in_stack_fffffffffffffafe,
                                        CONCAT15(in_stack_fffffffffffffafd,
                                                 CONCAT14(in_stack_fffffffffffffafc,
                                                          in_stack_fffffffffffffaf8)))));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_68 = pGVar3;
  local_90 = GrcSymbolTableEntry::InternalID(pGVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"directionality",&local_b9);
  pGVar3 = GrcSymbolTable::FindSymbol
                     (in_stack_fffffffffffffb00,
                      (string *)
                      CONCAT17(in_stack_fffffffffffffaff,
                               CONCAT16(in_stack_fffffffffffffafe,
                                        CONCAT15(in_stack_fffffffffffffafd,
                                                 CONCAT14(in_stack_fffffffffffffafc,
                                                          in_stack_fffffffffffffaf8)))));
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_98 = pGVar3;
  local_c0 = GrcSymbolTableEntry::InternalID(pGVar3);
  local_c8 = (GrcSymbolTableEntry *)0x0;
  local_cc = 0;
  local_d8 = (GrcSymbolTableEntry *)0x0;
  local_dc = 0;
  bVar1 = IncludePassOptimizations(in_RDI);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"*skipPasses*",&local_101);
    local_c8 = GrcSymbolTable::FindSymbol
                         (in_stack_fffffffffffffb00,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffaff,
                                   CONCAT16(in_stack_fffffffffffffafe,
                                            CONCAT15(in_stack_fffffffffffffafd,
                                                     CONCAT14(in_stack_fffffffffffffafc,
                                                              in_stack_fffffffffffffaf8)))));
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    local_cc = GrcSymbolTableEntry::InternalID(local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"*skipPasses2*",&local_129);
    local_d8 = GrcSymbolTable::FindSymbol
                         (in_stack_fffffffffffffb00,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffaff,
                                   CONCAT16(in_stack_fffffffffffffafe,
                                            CONCAT15(in_stack_fffffffffffffafd,
                                                     CONCAT14(in_stack_fffffffffffffafc,
                                                              in_stack_fffffffffffffaf8)))));
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    if (local_d8 != (GrcSymbolTableEntry *)0x0) {
      local_dc = GrcSymbolTableEntry::InternalID(local_d8);
    }
  }
  this_01 = (GrcSymbolTableEntry *)in_RDI->m_psymtbl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"justify",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"stretch",&local_199);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0);
  pGVar3 = GrcSymbolTable::FindSymbol
                     ((GrcSymbolTable *)
                      CONCAT44(in_stack_fffffffffffffb2c,
                               CONCAT13(in_stack_fffffffffffffb2b,
                                        CONCAT12(in_stack_fffffffffffffb2a,
                                                 CONCAT11(in_stack_fffffffffffffb29,
                                                          in_stack_fffffffffffffb28)))),
                      (GrcStructName *)
                      CONCAT17(in_stack_fffffffffffffb27,
                               CONCAT16(in_stack_fffffffffffffb26,in_stack_fffffffffffffb20)));
  GrcStructName::~GrcStructName((GrcStructName *)0x12136b);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  local_138 = pGVar3;
  local_1a0 = GrcSymbolTableEntry::InternalID(pGVar3);
  for (local_1a8 = 0; uVar11 = local_1a8,
      sVar4 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::size
                        (&in_RDI->m_vpsymGlyphAttrs), uVar11 < sVar4; local_1a8 = local_1a8 + 1) {
    ppGVar5 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::operator[]
                        (&in_RDI->m_vpsymGlyphAttrs,local_1a8);
    local_1b0 = *ppGVar5;
    iVar2 = GrcSymbolTableEntry::InternalID(local_1b0);
    if (iVar2 == (int)local_1a8) {
      GrcSymbolTableEntry::ExpType(local_1b0);
      ExpressionDebugString_abi_cxx11_(in_stack_fffffffffffffb2c);
      if (local_1a8 == local_90) {
        std::__cxx11::string::operator=(local_1d0,"bw");
      }
      else if (local_1a8 == local_c0) {
        std::__cxx11::string::operator=(local_1d0,"dircode");
      }
      else if (local_1a8 == local_60) {
        std::__cxx11::string::operator=(local_1d0,"gid");
      }
      else if ((local_1a8 == local_cc) || (local_1a8 == local_dc)) {
        std::__cxx11::string::operator=(local_1d0,"bitmap");
      }
      else {
        bVar1 = GrcSymbolTableEntry::IsPointField(this_01);
        if (bVar1) {
          std::__cxx11::string::operator=(local_1d0,"point");
        }
        else {
          bVar1 = GrcSymbolTableEntry::IsComponentBoxField
                            ((GrcSymbolTableEntry *)
                             CONCAT26(in_stack_fffffffffffffad6,
                                      CONCAT24(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0))
                            );
          if (bVar1) {
            std::__cxx11::string::operator=(local_1d0,"comp");
          }
        }
      }
      poVar6 = std::operator<<(local_18,"    <glyphAttr name=\"");
      GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffb08);
      poVar6 = std::operator<<(poVar6,local_1f0);
      poVar6 = std::operator<<(poVar6,"\" attrId=\"");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1a8);
      poVar6 = std::operator<<(poVar6,"\" type=\"");
      poVar6 = std::operator<<(poVar6,local_1d0);
      std::operator<<(poVar6,"\" />\n");
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_1d0);
    }
  }
  std::operator<<(local_18,"  </glyphAttrs>\n\n");
  local_1f4 = GrcFont::NumUnicode(local_10);
  uVar10 = (ulong)local_1f4;
  uVar11 = uVar10 * 2;
  if (CARRY8(uVar10,uVar10)) {
    uVar11 = 0xffffffffffffffff;
  }
  local_200 = (GdlNumericExpression *)operator_new__(uVar11);
  local_208 = (GdlNumericExpression *)operator_new__(0x40000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12182d);
  sta = local_238;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x121842);
  CmapAndInverse(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                 (int)((ulong)in_stack_fffffffffffffb40 >> 0x20),(utf16 *)in_stack_fffffffffffffb38,
                 (uint *)in_stack_fffffffffffffb30,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffb2c,
                          CONCAT13(in_stack_fffffffffffffb2b,
                                   CONCAT12(in_stack_fffffffffffffb2a,
                                            CONCAT11(in_stack_fffffffffffffb29,
                                                     in_stack_fffffffffffffb28)))),
                 in_stack_fffffffffffffb60);
  std::operator<<(local_18,"  <glyphs>\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1218a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1218b6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1218c3);
  std::__cxx11::string::string(local_2a0,in_RCX);
  GdlRenderer::RecordSingleMemberClasses
            ((GdlRenderer *)in_stack_fffffffffffffb50,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30);
  std::__cxx11::string::~string(local_2a0);
  local_2a4 = TableVersion(in_RDI,0x13);
  local_2a8 = 0;
  do {
    if (in_RDI->m_cwGlyphIDs <= (ulong)local_2a8) {
      std::operator<<(local_18,"  </glyphs>\n\n");
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT26(in_stack_fffffffffffffad6,
                          CONCAT24(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT26(in_stack_fffffffffffffad6,
                            CONCAT24(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT26(in_stack_fffffffffffffad6,
                            CONCAT24(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 CONCAT26(in_stack_fffffffffffffad6,
                          CONCAT24(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT26(in_stack_fffffffffffffad6,
                          CONCAT24(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)));
      return;
    }
    poVar6 = std::operator<<(local_18,"    <glyph glyphid=\"");
    std::ostream::operator<<(poVar6,local_2a8);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_250);
    if (local_2a8 < sVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_250,(ulong)local_2a8);
      bVar1 = std::operator!=(&in_stack_fffffffffffffac0->m_staFieldName,(char *)sta);
      if (bVar1) {
        poVar6 = std::operator<<(local_18,"\" className=\"");
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_250,(ulong)local_2a8);
        std::operator<<(poVar6,(string *)pvVar7);
      }
    }
    if (*(int *)((long)&local_208->field_0x0 + (ulong)local_2a8 * 4) != 0) {
      std::operator<<(local_18,"\" usv=\"");
      DebugUnicode((ostream *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                   SUB41(in_stack_fffffffffffffad8 >> 0x18,0));
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_268);
    if (local_2a8 < sVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_268,(ulong)local_2a8);
      bVar1 = std::operator!=(&in_stack_fffffffffffffac0->m_staFieldName,(char *)sta);
      if (bVar1) {
        poVar6 = std::operator<<(local_18,"\" inFile=\"");
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_268,(ulong)local_2a8);
        poVar6 = std::operator<<(poVar6,(string *)pvVar7);
        poVar6 = std::operator<<(poVar6,"\" atLine=\"");
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_280,(ulong)local_2a8);
        std::ostream::operator<<(poVar6,*pvVar8);
      }
    }
    this_00 = (GrpLineAndFile *)std::operator<<(local_18,"\"");
    std::operator<<((ostream *)this_00,">\n");
    local_2ac = 0;
    while( true ) {
      staPath = (string *)(ulong)local_2ac;
      psVar9 = (string *)
               std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::size
                         (&in_RDI->m_vpsymGlyphAttrs);
      if (psVar9 <= staPath) break;
      local_2b0 = FinalAttrValue((GrcManager *)
                                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                                 in_stack_fffffffffffffad6,in_stack_fffffffffffffad0);
      if ((local_2ac != local_60) || (local_2b0 != 0)) {
        std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::operator[]
                  (&in_RDI->m_vpsymGlyphAttrs,(ulong)local_2ac);
        bVar1 = GrcSymbolTableEntry::IsMirrorAttr((GrcSymbolTableEntry *)in_stack_fffffffffffffac8);
        if (((!bVar1) && (local_2ac != local_c0)) ||
           (bVar1 = GdlRenderer::Bidi(in_RDI->m_prndr), bVar1)) {
          GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)0x121d27);
          in_stack_fffffffffffffac8 = (GdlRenderer *)local_2f0;
          in_stack_fffffffffffffac0 = (GrcSymbolTableEntry *)(local_2f0 + 0x2e);
          sta = local_2c1;
          GrcGlyphAttrMatrix::Get
                    ((GrcGlyphAttrMatrix *)
                     CONCAT17(in_stack_fffffffffffffaff,
                              CONCAT16(in_stack_fffffffffffffafe,
                                       CONCAT15(in_stack_fffffffffffffafd,
                                                CONCAT14(in_stack_fffffffffffffafc,
                                                         in_stack_fffffffffffffaf8)))),
                     (gid16)((ulong)in_stack_fffffffffffffaf0 >> 0x30),
                     (int)in_stack_fffffffffffffaf0,(GdlExpression **)in_stack_fffffffffffffae8,
                     (int *)in_stack_fffffffffffffae0,
                     (int *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     (bool *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb18,
                     (GrpLineAndFile *)
                     CONCAT17(in_stack_fffffffffffffb27,
                              CONCAT16(in_stack_fffffffffffffb26,in_stack_fffffffffffffb20)));
          ppGVar5 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::
                    operator[](&in_RDI->m_vpsymGlyphAttrs,(ulong)local_2ac);
          bVar1 = GrcSymbolTableEntry::IsUserDefined(*ppGVar5);
          if ((!bVar1) ||
             (bVar1 = GrcGlyphAttrMatrix::Defined
                                ((GrcGlyphAttrMatrix *)
                                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                                 in_stack_fffffffffffffad6,in_stack_fffffffffffffad0,
                                 (int)((ulong)in_stack_fffffffffffffac8 >> 0x20)), bVar1)) {
            in_stack_fffffffffffffb27 = GdlRenderer::HasCollisionPass(in_stack_fffffffffffffac8);
            if (!(bool)in_stack_fffffffffffffb27) {
              std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::operator[]
                        (&in_RDI->m_vpsymGlyphAttrs,(ulong)local_2ac);
              in_stack_fffffffffffffb26 =
                   GrcSymbolTableEntry::IsCollisionAttr
                             ((GrcSymbolTableEntry *)in_stack_fffffffffffffac8);
              if ((bool)in_stack_fffffffffffffb26) {
                local_2f4 = 10;
                goto LAB_001221af;
              }
            }
            in_stack_fffffffffffffb18 =
                 (ofstream *)std::operator<<(local_18,"      <glyphAttrValue name=\"");
            std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::operator[]
                      (&in_RDI->m_vpsymGlyphAttrs,(ulong)local_2ac);
            GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffb08);
            in_stack_fffffffffffffb10 =
                 std::operator<<((ostream *)in_stack_fffffffffffffb18,local_318);
            std::operator<<(in_stack_fffffffffffffb10,"\" value=\"");
            std::__cxx11::string::~string(local_318);
            std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::operator[]
                      (&in_RDI->m_vpsymGlyphAttrs,(ulong)local_2ac);
            in_stack_fffffffffffffb08 = (GrcSymbolTableEntry *)local_339;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_339 + 1),"gpoint",(allocator *)in_stack_fffffffffffffb08);
            in_stack_fffffffffffffaff =
                 GrcSymbolTableEntry::LastFieldIs(in_stack_fffffffffffffac0,sta);
            in_stack_fffffffffffffafd = (bool)in_stack_fffffffffffffaff && local_2b0 == -2;
            in_stack_fffffffffffffafe = in_stack_fffffffffffffafd;
            std::__cxx11::string::~string((string *)(local_339 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_339);
            if ((in_stack_fffffffffffffafd & 1) == 0) {
              std::ostream::operator<<(local_18,local_2b0);
            }
            else {
              std::operator<<(local_18,"zero");
            }
            in_stack_fffffffffffffafc = GrpLineAndFile::NotSet((GrpLineAndFile *)local_2f0);
            if (!(bool)in_stack_fffffffffffffafc) {
              in_stack_fffffffffffffaf0 = std::operator<<(local_18,"\" inFile=\"");
              std::__cxx11::string::string(local_380,in_RCX);
              GrpLineAndFile::FileWithPath(this_00,staPath);
              in_stack_fffffffffffffae8 =
                   (string *)std::operator<<(in_stack_fffffffffffffaf0,local_360);
              in_stack_fffffffffffffae0 =
                   (string *)std::operator<<((ostream *)in_stack_fffffffffffffae8,"\" atLine=\"");
              in_stack_fffffffffffffadc = GrpLineAndFile::OriginalLine((GrpLineAndFile *)local_2f0);
              std::ostream::operator<<(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
              std::__cxx11::string::~string(local_360);
              std::__cxx11::string::~string(local_380);
            }
            std::operator<<(local_18,"\" />\n");
            local_2f4 = 0;
          }
          else {
            local_2f4 = 10;
          }
LAB_001221af:
          GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1221bc);
        }
      }
      local_2ac = local_2ac + 1;
    }
    if (((0x2ffff < local_2a4) && (local_2a8 < in_RDI->m_wGlyphIDLim)) &&
       (in_stack_fffffffffffffad8 = local_2a8,
       sVar4 = std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::size
                         (&in_RDI->m_vgbdy), in_stack_fffffffffffffad8 < (uint)sVar4)) {
      std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::operator[]
                (&in_RDI->m_vgbdy,(ulong)local_2a8);
      GlyphBoundaries::DebugXml
                ((GlyphBoundaries *)
                 CONCAT17(in_stack_fffffffffffffb27,
                          CONCAT16(in_stack_fffffffffffffb26,in_stack_fffffffffffffb20)),
                 in_stack_fffffffffffffb18);
    }
    std::operator<<(local_18,"    </glyph>\n");
    local_2a8 = local_2a8 + 1;
  } while( true );
}

Assistant:

void GrcManager::DebugXmlGlyphs(GrcFont * pfont, std::ofstream & strmOut,
	std::string staPathToCur)
{
	// Glyph attribute definitions

	strmOut << "  <glyphAttrs>\n";

	Symbol psymActual = m_psymtbl->FindSymbol("*actualForPseudo*");
	unsigned int nAttrIdActual = psymActual->InternalID();
	Symbol psymBw = m_psymtbl->FindSymbol("breakweight");
	unsigned int nAttrIdBw = psymBw->InternalID();
	Symbol psymDir = m_psymtbl->FindSymbol("directionality");
	unsigned int nAttrIdDir = psymDir->InternalID();
	Symbol psymSkipP = NULL;
	unsigned int nAttrIdSkipP = 0;
	Symbol psymSkipP2 = NULL;
	unsigned int nAttrIdSkipP2 = 0;
	if (this->IncludePassOptimizations())
	{
		psymSkipP = m_psymtbl->FindSymbol("*skipPasses*");
		nAttrIdSkipP = psymSkipP->InternalID();
		psymSkipP2 = m_psymtbl->FindSymbol("*skipPasses2*");
		if (psymSkipP2)
			nAttrIdSkipP2 = psymSkipP2->InternalID();
	}

	//Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "0", "stretch"));
	Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "stretch"));
	int nAttrIdJStr = psymJStr->InternalID();

	for (size_t nAttrID = 0; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
	{
		Symbol psymGlyphAttr = m_vpsymGlyphAttrs[nAttrID];

		//if ((psymGlyphAttr->IsMirrorAttr() || nAttrID == nAttrIdDir)
		//		&& !m_prndr->Bidi())
		//	continue;

		if (psymGlyphAttr->InternalID() == static_cast<int>(nAttrID))
		{
			std::string staExpType = ExpressionDebugString(psymGlyphAttr->ExpType());
			if (nAttrID == nAttrIdBw)
				staExpType = "bw";
			else if (nAttrID == nAttrIdDir)
				staExpType = "dircode";
			else if (nAttrID == nAttrIdActual)
				staExpType = "gid";
			else if (nAttrID == nAttrIdSkipP || nAttrID == nAttrIdSkipP2)
				staExpType = "bitmap";
			else if (psymGlyphAttr->IsPointField())
				staExpType = "point";
			else if (psymGlyphAttr->IsComponentBoxField())
				staExpType = "comp";

			strmOut << "    <glyphAttr name=\"" << psymGlyphAttr->FullName() 
				<< "\" attrId=\"" << nAttrID 
				<< "\" type=\"" << staExpType
				<< "\" />\n";
		}
		// else we have something like justify.stretch which is unused
	}

	strmOut << "  </glyphAttrs>\n\n";

	// Glyphs and their attribute values

	// Generate the cmap.
	int cnUni = pfont->NumUnicode();
	utf16 * rgchwUniToGlyphID = new utf16[cnUni];
	unsigned int * rgnGlyphIDToUni = new unsigned int[0x10000];
	std::vector<unsigned int> vnXUniForPsd;
	std::vector<utf16> vwXPsdForUni;
	CmapAndInverse(pfont, cnUni, rgchwUniToGlyphID, rgnGlyphIDToUni,
		vnXUniForPsd, vwXPsdForUni);

	strmOut << "  <glyphs>\n";

	std::vector<std::string> vstaSingleMemberClasses;
	std::vector<std::string> vstaSingleMemberClassFiles;
	std::vector<int> vnSingleMemberClassLines;
	m_prndr->RecordSingleMemberClasses(vstaSingleMemberClasses,
		vstaSingleMemberClassFiles, vnSingleMemberClassLines, staPathToCur);

	int fxdGlatVersion = TableVersion(ktiGlat);

	for (auto wGlyphID = 0U; wGlyphID < m_cwGlyphIDs; wGlyphID++)
	{
		// Convert breakweight values depending on the table version to output.
		////ConvertBwForVersion(wGlyphID, nAttrIdBw);

		//	Split any large stretch values into two 16-bit words.
		////SplitLargeStretchValue(wGlyphID, nAttrIdJStr);

		strmOut << "    <glyph glyphid=\"" << wGlyphID;
		if (vstaSingleMemberClasses.size() > (unsigned)wGlyphID && vstaSingleMemberClasses[wGlyphID] != "")
			strmOut << "\" className=\"" << vstaSingleMemberClasses[wGlyphID];
		if (rgnGlyphIDToUni[wGlyphID] != 0)
		{
			strmOut << "\" usv=\""; 
			DebugUnicode(strmOut, rgnGlyphIDToUni[wGlyphID], false);
		}
		if (vstaSingleMemberClassFiles.size() > (unsigned)wGlyphID && vstaSingleMemberClassFiles[wGlyphID] != "")
			strmOut << "\" inFile=\"" << vstaSingleMemberClassFiles[wGlyphID]
				<< "\" atLine=\"" << vnSingleMemberClassLines[wGlyphID];
		strmOut<< "\"" << ">\n";
	
		for (auto nAttrID = 0U; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
		{
			int nValue = FinalAttrValue(wGlyphID, nAttrID);

			if (nAttrID == nAttrIdActual && nValue == 0)
				continue;

			if ((m_vpsymGlyphAttrs[nAttrID]->IsMirrorAttr() || nAttrID == nAttrIdDir)
					&& m_prndr->Bidi() == 0)
				// Ignore mirror and directionality attribute for non-bidi.
				continue;

			// Get the original expression where this attribute was set.
			GdlExpression * pexp;
			int nPR;
			int munitPR;
			bool fOverride, fShadow;
			GrpLineAndFile lnf;
			m_pgax->Get(wGlyphID, nAttrID,
				&pexp, &nPR, &munitPR, &fOverride, &fShadow, &lnf);

			if (m_vpsymGlyphAttrs[nAttrID]->IsUserDefined() && !m_pgax->Defined(wGlyphID, nAttrID))
				// Attribute not defined for this glyph.
				continue;

			if (! m_prndr->HasCollisionPass() && m_vpsymGlyphAttrs[nAttrID]->IsCollisionAttr())
				// Ignore collision attributes when there is no collision pass.
				continue;

			strmOut << "      <glyphAttrValue name=\"" << m_vpsymGlyphAttrs[nAttrID]->FullName()
				<< "\" value=\"";
			if (m_vpsymGlyphAttrs[nAttrID]->LastFieldIs("gpoint") && nValue == kGpointZero)
				strmOut << "zero";
			else
				strmOut  << nValue;

			if (!lnf.NotSet())
				strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
					<< "\" atLine=\"" << lnf.OriginalLine();

			strmOut << "\" />\n";
		}

		if (fxdGlatVersion >= 0x00030000)
		{
			// Output glyph-approximation octaboxes.
			if (wGlyphID < m_wGlyphIDLim && wGlyphID < (int)m_vgbdy.size())
				m_vgbdy[wGlyphID].DebugXml(strmOut);
		}

		strmOut << "    </glyph>\n";
	}

	strmOut << "  </glyphs>\n\n";
}